

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharAndCodeTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  String *in_RSI;
  byte in_DIL;
  CharFormat format;
  String *in_stack_ffffffffffffffa0;
  String *this;
  String local_48;
  ostream *in_stack_ffffffffffffffc8;
  uchar in_stack_ffffffffffffffd3;
  String local_28;
  CharFormat local_14;
  String *local_10;
  byte local_1;
  
  local_10 = in_RSI;
  local_1 = in_DIL;
  std::operator<<((ostream *)in_RSI,"\'");
  local_14 = PrintAsCharLiteralTo<unsigned_char,unsigned_char>
                       (in_stack_ffffffffffffffd3,in_stack_ffffffffffffffc8);
  std::operator<<((ostream *)local_10,"\'");
  if (local_1 != 0) {
    poVar1 = std::operator<<((ostream *)local_10," (");
    String::Format((char *)&local_28,"%d",(ulong)local_1);
    pcVar2 = String::c_str(&local_28);
    std::operator<<(poVar1,pcVar2);
    String::~String(in_stack_ffffffffffffffa0);
    if ((local_14 != kHexEscape) && ((local_1 == 0 || (9 < local_1)))) {
      this = local_10;
      String::Format((char *)&local_48,", 0x%X",(ulong)local_1);
      pcVar2 = String::c_str(&local_48);
      std::operator<<((ostream *)this,pcVar2);
      String::~String(this);
    }
    std::operator<<((ostream *)local_10,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << String::Format("%d", c).c_str();

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << String::Format(", 0x%X",
                          static_cast<UnsignedChar>(c)).c_str();
  }
  *os << ")";
}